

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_text_colored(nk_context *ctx,char *str,int len,nk_flags alignment,nk_color color)

{
  nk_window *pnVar1;
  nk_rect bounds;
  nk_text local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4950,
                  "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
                 );
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    if (pnVar1->layout != (nk_panel *)0x0) {
      nk_panel_alloc_space(&local_40,ctx);
      local_50.padding = (ctx->style).text.padding;
      local_50.background = (ctx->style).window.background;
      local_50.text = color;
      nk_widget_text(&pnVar1->buffer,local_40,str,len,&local_50,alignment,(ctx->style).font);
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4952,
                  "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4951,
                "void nk_text_colored(struct nk_context *, const char *, int, nk_flags, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_text_colored(struct nk_context *ctx, const char *str, int len,
    nk_flags alignment, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text(&win->buffer, bounds, str, len, &text, alignment, style->font);
}